

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,void *end,
                       ZSTD_dictTableLoadMethod_e dtlm)

{
  long lVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  size_t hash;
  U32 i;
  U32 current;
  U32 fastHashFillStep;
  BYTE *iend;
  BYTE *ip;
  BYTE *base;
  U32 mls;
  U32 hBits;
  U32 *hashTable;
  size_t in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar3;
  undefined8 local_40;
  
  lVar1 = *(long *)(in_RDI + 0x30);
  lVar2 = *(long *)(in_RDI + 8);
  local_40 = lVar2 + (ulong)*(uint *)(in_RDI + 0x24);
  do {
    if (in_RDX - 8U < local_40 + 2U) {
      return;
    }
    for (uVar3 = 0; uVar3 < 3; uVar3 = uVar3 + 1) {
      in_stack_ffffffffffffffa0 =
           ZSTD_hashPtr((void *)CONCAT44(uVar3,in_stack_ffffffffffffffa8),
                        (U32)(in_stack_ffffffffffffffa0 >> 0x20),(U32)in_stack_ffffffffffffffa0);
      if ((uVar3 == 0) || (*(int *)(lVar1 + in_stack_ffffffffffffffa0 * 4) == 0)) {
        *(uint *)(lVar1 + in_stack_ffffffffffffffa0 * 4) = ((int)local_40 - (int)lVar2) + uVar3;
      }
      if (in_ECX == 0) break;
    }
    local_40 = local_40 + 3;
  } while( true );
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        ZSTD_compressionParameters const* cParams,
                        void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->searchLength;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const hash = ZSTD_hashPtr(ip + i, hBits, mls);
            if (i == 0 || hashTable[hash] == 0)
                hashTable[hash] = current + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
        }
    }
}